

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

int64 __thiscall
TTD::EventLog::FindSnapTimeForEventTime(EventLog *this,int64 targetTime,int64 *optEndSnapTime)

{
  bool bVar1;
  bool bVar2;
  BaseDictionary<const_TTD::NSLogEvents::EventLogEntry_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar3;
  EventLogEntry *pEVar4;
  SnapshotEventLogEntry *pSVar5;
  SnapshotEventLogEntry *snapEvent;
  Iterator iter_1;
  bool validSnap;
  int64 time;
  undefined1 local_48 [5];
  bool hasRtrSnap;
  bool isRoot;
  bool isSnap;
  Iterator iter;
  int64 snapTime;
  int64 *optEndSnapTime_local;
  int64 targetTime_local;
  EventLog *this_local;
  
  iter.m_previousEventMap =
       (BaseDictionary<const_TTD::NSLogEvents::EventLogEntry_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        *)&DAT_ffffffffffffffff;
  if (optEndSnapTime != (int64 *)0x0) {
    *optEndSnapTime = -1;
  }
  TTEventList::GetIteratorAtLast_ReplayOnly((Iterator *)local_48,&this->m_eventList);
  while (bVar2 = TTEventList::Iterator::IsValid((Iterator *)local_48),
        pBVar3 = iter.m_previousEventMap, bVar2) {
    time._7_1_ = 0;
    time._6_1_ = 0;
    time._5_1_ = 0;
    pEVar4 = TTEventList::Iterator::Current((Iterator *)local_48);
    pBVar3 = (BaseDictionary<const_TTD::NSLogEvents::EventLogEntry_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              *)NSLogEvents::AccessTimeInRootCallOrSnapshot
                          (pEVar4,(bool *)((long)&time + 7),(bool *)((long)&time + 6),
                           (bool *)((long)&time + 5));
    bVar2 = (time._7_1_ & 1) != 0;
    bVar1 = (time._6_1_ & 1 & time._5_1_ & 1) != 0;
    iter_1.m_previousEventMap._7_1_ = bVar2 || bVar1;
    if ((bVar2 || bVar1) && ((long)pBVar3 <= targetTime)) break;
    TTEventList::Iterator::MovePrevious_ReplayOnly((Iterator *)local_48);
  }
  iter.m_previousEventMap = pBVar3;
  if (optEndSnapTime != (int64 *)0x0) {
    TTEventList::GetIteratorAtFirst((Iterator *)&snapEvent,&this->m_eventList);
    while (bVar2 = TTEventList::Iterator::IsValid((Iterator *)&snapEvent), bVar2) {
      pEVar4 = TTEventList::Iterator::Current((Iterator *)&snapEvent);
      if (pEVar4->EventKind == SnapshotTag) {
        pEVar4 = TTEventList::Iterator::Current((Iterator *)&snapEvent);
        pSVar5 = NSLogEvents::
                 GetInlineEventDataAs<TTD::NSLogEvents::SnapshotEventLogEntry,(TTD::NSLogEvents::EventKind)1>
                           (pEVar4);
        if ((long)iter.m_previousEventMap < pSVar5->RestoreTimestamp) {
          *optEndSnapTime = pSVar5->RestoreTimestamp;
          return (int64)iter.m_previousEventMap;
        }
      }
      TTEventList::Iterator::MoveNext((Iterator *)&snapEvent);
    }
  }
  return (int64)iter.m_previousEventMap;
}

Assistant:

int64 EventLog::FindSnapTimeForEventTime(int64 targetTime, int64* optEndSnapTime)
    {
        int64 snapTime = -1;
        if(optEndSnapTime != nullptr)
        {
            *optEndSnapTime = -1;
        }

        for(auto iter = this->m_eventList.GetIteratorAtLast_ReplayOnly(); iter.IsValid(); iter.MovePrevious_ReplayOnly())
        {
            bool isSnap = false;
            bool isRoot = false;
            bool hasRtrSnap = false;
            int64 time = NSLogEvents::AccessTimeInRootCallOrSnapshot(iter.Current(), isSnap, isRoot, hasRtrSnap);

            bool validSnap =  isSnap | (isRoot & hasRtrSnap);
            if(validSnap && time <= targetTime)
            {
                snapTime = time;
                break;
            }
        }

        if(optEndSnapTime != nullptr)
        {
            for(auto iter = this->m_eventList.GetIteratorAtFirst(); iter.IsValid(); iter.MoveNext())
            {
                if(iter.Current()->EventKind == NSLogEvents::EventKind::SnapshotTag)
                {
                    NSLogEvents::SnapshotEventLogEntry* snapEvent = NSLogEvents::GetInlineEventDataAs<NSLogEvents::SnapshotEventLogEntry, NSLogEvents::EventKind::SnapshotTag>(iter.Current());
                    if(snapEvent->RestoreTimestamp > snapTime)
                    {
                        *optEndSnapTime = snapEvent->RestoreTimestamp;
                        break;
                    }
                }
            }
        }

        return snapTime;
    }